

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uint32_t __thiscall
CompiledProjectOperator::evaluateExpr_
          (CompiledProjectOperator *this,DbVector **res,BatchResult *input)

{
  uint n;
  int32_t *piVar1;
  int32_t *piVar2;
  int32_t *piVar3;
  int32_t *piVar4;
  DbVector *pDVar5;
  uint32_t i;
  ulong uVar6;
  allocator<char> local_51;
  string local_50;
  
  n = **(uint **)((input->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"extprice",&local_51);
  pDVar5 = BatchResult::getCol(input,&local_50);
  piVar1 = pDVar5->col;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"discount",&local_51);
  pDVar5 = BatchResult::getCol(input,&local_50);
  piVar2 = pDVar5->col;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"tax",&local_51);
  pDVar5 = BatchResult::getCol(input,&local_50);
  piVar3 = pDVar5->col;
  std::__cxx11::string::~string((string *)&local_50);
  pDVar5 = (DbVector *)operator_new(0x10);
  DbVector::DbVector(pDVar5,n);
  *res = pDVar5;
  piVar4 = pDVar5->col;
  for (uVar6 = 0; n != uVar6; uVar6 = uVar6 + 1) {
    piVar4[uVar6] = (piVar3[uVar6] + 1) * (1 - piVar2[uVar6]) * piVar1[uVar6];
  }
  return n;
}

Assistant:

uint32_t evaluateExpr_(DbVector** res, BatchResult* input) {
        uint32_t n = input->getn();
        int32_t *extprice = input->getCol("extprice")->col;
        int32_t *discount = input->getCol("discount")->col;
        int32_t *tax = input->getCol("tax")->col;

        *res = new DbVector(n);
        int32_t *r = (*res)->col;

        for (uint32_t i = 0; i < n; i++) {
            r[i] = extprice[i] * (1 - discount[i]) * (1 + tax[i]);
        }

        return n;
    }